

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

int nva_rd(nva_regspace *regspace,uint32_t addr,uint64_t *val)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint64_t *puVar8;
  uint32_t savecfg;
  uint32_t savepos;
  uint32_t vstbase;
  uint8_t idx_1;
  int iStack_48;
  uint8_t idx;
  uint32_t vgabase;
  uint32_t vgaio;
  int i;
  void *raw;
  size_t rawlen;
  void *rawbase;
  uint64_t *val_local;
  uint32_t addr_local;
  nva_regspace *regspace_local;
  
  switch(regspace->type) {
  case NVA_REGSPACE_BAR0:
    rawlen = (size_t)regspace->card->bar0;
    raw = (void *)regspace->card->bar0len;
    goto LAB_0010442e;
  case NVA_REGSPACE_BAR1:
    rawlen = (size_t)regspace->card->bar1;
    raw = (void *)regspace->card->bar1len;
    goto LAB_0010442e;
  case NVA_REGSPACE_BAR2:
    rawlen = (size_t)regspace->card->bar2;
    raw = (void *)regspace->card->bar2len;
    goto LAB_0010442e;
  case NVA_REGSPACE_IOBAR:
    if (regspace->card->iobar == (pci_io_handle *)0x0) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->card->iobarlen - (long)regspace->regsz < (ulong)addr) {
      regspace_local._4_4_ = 1;
    }
    else {
      iVar1 = regspace->regsz;
      if (iVar1 == 1) {
        bVar2 = pci_io_read8(regspace->card->iobar,addr);
        *val = (ulong)bVar2;
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 2) {
        uVar3 = pci_io_read16(regspace->card->iobar,addr);
        *val = (ulong)uVar3;
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 4) {
        uVar4 = pci_io_read32(regspace->card->iobar,addr);
        *val = (ulong)uVar4;
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    break;
  case NVA_REGSPACE_RAWMEM:
    rawlen = (size_t)regspace->card->rawmem;
    raw = &Elf64_Ehdr_00100000;
LAB_0010442e:
    if (rawlen == 0) {
      regspace_local._4_4_ = 4;
    }
    else if ((ulong)((long)raw - (long)regspace->regsz) < (ulong)addr) {
      regspace_local._4_4_ = 1;
    }
    else {
      puVar8 = (uint64_t *)(rawlen + addr);
      switch(regspace->regsz) {
      case 1:
        *val = (ulong)(byte)*puVar8;
        regspace_local._4_4_ = 0;
        break;
      case 2:
        *val = (ulong)(ushort)*puVar8;
        regspace_local._4_4_ = 0;
        break;
      default:
        regspace_local._4_4_ = 2;
        break;
      case 4:
        *val = (ulong)(uint)*puVar8;
        regspace_local._4_4_ = 0;
        break;
      case 8:
        *val = *puVar8;
        regspace_local._4_4_ = 0;
      }
    }
    break;
  case NVA_REGSPACE_RAWIO:
    if (regspace->card->rawio == (pci_io_handle *)0x0) {
      regspace_local._4_4_ = 3;
    }
    else if (0x10000U - regspace->regsz < addr) {
      regspace_local._4_4_ = 1;
    }
    else {
      iVar1 = regspace->regsz;
      if (iVar1 == 1) {
        bVar2 = pci_io_read8(regspace->card->rawio,addr);
        *val = (ulong)bVar2;
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 2) {
        uVar3 = pci_io_read16(regspace->card->rawio,addr);
        *val = (ulong)uVar3;
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 4) {
        uVar4 = pci_io_read32(regspace->card->rawio,addr);
        *val = (ulong)uVar4;
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    break;
  case NVA_REGSPACE_PDAC:
    if ((regspace->card->chipset).chipset == 1) {
      if (0x10000U - regspace->regsz < addr) {
        regspace_local._4_4_ = 1;
      }
      else if (regspace->regsz < 9) {
        nva_wr32(regspace->cnum,0x609010,addr & 0xff);
        nva_wr32(regspace->cnum,0x609014,addr >> 8);
        *val = 0;
        for (vgabase = 0; (int)vgabase < regspace->regsz; vgabase = vgabase + 1) {
          uVar7 = nva_rd32(regspace->cnum,0x609018);
          *val = (ulong)(uVar7 & 0xff) << ((byte)(vgabase << 3) & 0x3f) | *val;
        }
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_EEPROM:
    if ((regspace->card->chipset).chipset == 1) {
      if (regspace->regsz == 1) {
        if (addr < 0x80) {
          do {
            uVar7 = nva_rd32(regspace->cnum,0x60a400);
          } while ((uVar7 & 0x10000000) != 0);
          nva_wr32(regspace->cnum,0x60a400,addr << 8 | 0x2000000);
          do {
            uVar7 = nva_rd32(regspace->cnum,0x60a400);
          } while ((uVar7 & 0x10000000) != 0);
          uVar7 = nva_rd32(regspace->cnum,0x60a400);
          *val = (ulong)(uVar7 & 0xff);
          regspace_local._4_4_ = 0;
        }
        else {
          regspace_local._4_4_ = 1;
        }
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_VGA_CR:
    iStack_48 = 0x3d4;
    if (0xff < addr) {
      return 1;
    }
    goto LAB_0010492c;
  case NVA_REGSPACE_VGA_SR:
    iStack_48 = 0x3c4;
    if (7 < addr) {
      return 1;
    }
    goto LAB_0010492c;
  case NVA_REGSPACE_VGA_AR:
    iStack_48 = 0x3c0;
    if (0x1f < addr) {
      return 1;
    }
    goto LAB_0010492c;
  case NVA_REGSPACE_VGA_GR:
    iStack_48 = 0x3ce;
    if (0xf < addr) {
      return 1;
    }
LAB_0010492c:
    if (regspace->regsz == 1) {
      if ((regspace->card->chipset).card_type == 1) {
        vstbase = 0x6d0000;
        if (regspace->idx != 0) {
          return 3;
        }
      }
      else if ((regspace->card->chipset).card_type < 0x50) {
        if ((iStack_48 == 0x3c4) || (iStack_48 == 0x3ce)) {
          vstbase = 0xc0000;
        }
        else {
          vstbase = 0x601000;
        }
        if (2 < regspace->idx) {
          return 3;
        }
        if (((((regspace->card->chipset).chipset < 0x17) ||
             ((regspace->card->chipset).chipset == 0x1a)) ||
            ((regspace->card->chipset).chipset == 0x20)) && (regspace->idx == 1)) {
          return 3;
        }
        vstbase = regspace->idx * 0x2000 + vstbase;
      }
      else {
        vstbase = 0x601000;
        if (regspace->idx != 0) {
          return 3;
        }
      }
      if (iStack_48 == 0x3c0) {
        nva_rd8(regspace->cnum,vstbase + 0x3da);
        uVar7 = nva_rd8(regspace->cnum,vstbase + 0x3c0);
        nva_rd8(regspace->cnum,vstbase + 0x3da);
        nva_wr8(regspace->cnum,vstbase + 0x3c0,addr);
        uVar5 = nva_rd8(regspace->cnum,vstbase + 0x3c1);
        *val = (ulong)uVar5;
        nva_rd8(regspace->cnum,vstbase + 0x3da);
        nva_wr8(regspace->cnum,vstbase + 0x3c0,uVar7 & 0xff);
      }
      else {
        uVar7 = nva_rd8(regspace->cnum,vstbase + iStack_48);
        nva_wr8(regspace->cnum,vstbase + iStack_48,addr);
        uVar5 = nva_rd8(regspace->cnum,vstbase + iStack_48 + 1);
        *val = (ulong)uVar5;
        nva_wr8(regspace->cnum,vstbase + iStack_48,uVar7 & 0xff);
      }
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_VGA_ST:
    if ((regspace->card->chipset).chipset < 0x41) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 1) {
      savecfg = 0x1380;
      if (0x4f < (regspace->card->chipset).card_type) {
        savecfg = 0x619e40;
      }
      uVar7 = nva_rd32(regspace->cnum,savecfg + 0xc);
      uVar5 = nva_rd32(regspace->cnum,savecfg + 8);
      nva_wr32(regspace->cnum,savecfg + 0xc,addr + 1);
      nva_wr32(regspace->cnum,savecfg + 8,7);
      uVar6 = nva_rd32(regspace->cnum,savecfg);
      *val = (ulong)uVar6;
      nva_wr32(regspace->cnum,savecfg + 8,uVar5);
      nva_wr32(regspace->cnum,savecfg + 0xc,uVar7);
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_DPRAM:
    if ((regspace->card->chipset).chipset == 0x34) {
      if (regspace->regsz == 4) {
        nva_wr32(regspace->cnum,0x400bb0,addr);
        uVar7 = nva_rd32(regspace->cnum,0x400bb4);
        *val = (ulong)uVar7;
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else if (((regspace->card->chipset).card_type < 4) ||
            (0x1f < (regspace->card->chipset).card_type)) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x400828,addr);
      uVar7 = nva_rd32(regspace->cnum,0x40082c);
      *val = (ulong)uVar7;
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_PIPE:
    if (((regspace->card->chipset).card_type < 0x10) || (0x4f < (regspace->card->chipset).card_type)
       ) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x400f50,addr);
      uVar7 = nva_rd32(regspace->cnum,0x400f54);
      *val = (ulong)uVar7;
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_RDI:
    if ((((regspace->card->chipset).chipset == 0x17) || ((regspace->card->chipset).chipset == 0x18))
       || ((regspace->card->chipset).chipset == 0x1f)) {
      if (regspace->regsz == 4) {
        nva_wr32(regspace->cnum,0x400a08,addr);
        uVar7 = nva_rd32(regspace->cnum,0x400a0c);
        *val = (ulong)uVar7;
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else if (((regspace->card->chipset).card_type < 0x20) ||
            (0x4f < (regspace->card->chipset).card_type)) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x400750,addr);
      uVar7 = nva_rd32(regspace->cnum,0x400754);
      *val = (ulong)uVar7;
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_RDIB:
    if (((regspace->card->chipset).card_type < 0x20) || (0x4f < (regspace->card->chipset).card_type)
       ) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x400750,addr);
      uVar7 = nva_rd32(regspace->cnum,0x400758);
      *val = (ulong)uVar7;
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_VCOMP_CODE:
    if ((regspace->card->chipset).chipset == 0xaf) {
      if (regspace->regsz == 4) {
        nva_wr32(regspace->cnum,0x1c17c8,addr);
        uVar7 = nva_rd32(regspace->cnum,0x1c17cc);
        *val = (ulong)uVar7;
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_VCOMP_REG:
    if ((regspace->card->chipset).chipset == 0xaf) {
      if (regspace->regsz == 8) {
        nva_wr32(regspace->cnum,0x1c17d0,addr >> 3);
        uVar7 = nva_rd32(regspace->cnum,0x1c17d4);
        *val = (ulong)uVar7;
        uVar7 = nva_rd32(regspace->cnum,0x1c17d8);
        *val = (ulong)uVar7 << 0x20 | *val;
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_MACRO_CODE:
    if ((regspace->card->chipset).chipset < 0xc0) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x40986c,0x10);
      nva_wr32(regspace->cnum,0x409ffc,2);
      nva_wr32(regspace->cnum,0x409928,0xc);
      do {
        uVar7 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar7 != 0);
      nva_wr32(regspace->cnum,0x40993c,0xf);
      nva_wr32(regspace->cnum,0x409928,10);
      do {
        uVar7 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar7 != 0);
      nva_wr32(regspace->cnum,0x40991c,1);
      nva_wr32(regspace->cnum,0x409928,1);
      do {
        uVar7 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar7 != 0);
      for (vgabase = 0; vgabase < addr; vgabase = vgabase + 4) {
        nva_wr32(regspace->cnum,0x409928,6);
        do {
          uVar7 = nva_rd32(regspace->cnum,0x409928);
        } while (uVar7 != 0);
      }
      nva_wr32(regspace->cnum,0x409928,6);
      do {
        uVar7 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar7 != 0);
      uVar7 = nva_rd32(regspace->cnum,0x409918);
      *val = (ulong)uVar7;
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_XT:
    if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x1700,0x30);
      nva_wr32(regspace->cnum,0x700004,addr);
      nva_wr32(regspace->cnum,0x70000,1);
      do {
        uVar7 = nva_rd32(regspace->cnum,0x70000);
      } while (uVar7 != 0);
      nva_wr32(regspace->cnum,0x700000,1);
      do {
        uVar7 = nva_rd32(regspace->cnum,0x700000);
      } while (uVar7 != 0);
      uVar7 = nva_rd32(regspace->cnum,0x700004);
      *val = (ulong)uVar7;
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  default:
    regspace_local._4_4_ = 3;
  }
  return regspace_local._4_4_;
}

Assistant:

int nva_rd(struct nva_regspace *regspace, uint32_t addr, uint64_t *val) {
	void *rawbase = 0;
	size_t rawlen;
	void *raw;
	int i;
	uint32_t vgaio;
	uint32_t vgabase;
	switch (regspace->type) {
		case NVA_REGSPACE_BAR0:
			rawbase = regspace->card->bar0;
			rawlen = regspace->card->bar0len;
			goto raw;
		case NVA_REGSPACE_BAR1:
			rawbase = regspace->card->bar1;
			rawlen = regspace->card->bar1len;
			goto raw;
		case NVA_REGSPACE_BAR2:
			rawbase = regspace->card->bar2;
			rawlen = regspace->card->bar2len;
			goto raw;
		case NVA_REGSPACE_RAWMEM:
			rawbase = regspace->card->rawmem;
			rawlen = 0x100000;
		raw:
			if (!rawbase)
				return NVA_ERR_MAP;
			if (addr > rawlen - regspace->regsz)
				return NVA_ERR_RANGE;
			raw = (uint8_t *)rawbase + addr;
			switch (regspace->regsz) {
				case 1:
					*val = *(volatile uint8_t *)raw;
					return 0;
				case 2:
					*val = *(volatile uint16_t *)raw;
					return 0;
				case 4:
					*val = *(volatile uint32_t *)raw;
					return 0;
				case 8:
					*val = *(volatile uint64_t *)raw;
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_IOBAR:
			if (!regspace->card->iobar)
				return NVA_ERR_NOSPC;
			if (addr > regspace->card->iobarlen - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					*val = pci_io_read8(regspace->card->iobar, addr);
					return 0;
				case 2:
					*val = pci_io_read16(regspace->card->iobar, addr);
					return 0;
				case 4:
					*val = pci_io_read32(regspace->card->iobar, addr);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_RAWIO:
			if (!regspace->card->rawio)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					*val = pci_io_read8(regspace->card->rawio, addr);
					return 0;
				case 2:
					*val = pci_io_read16(regspace->card->rawio, addr);
					return 0;
				case 4:
					*val = pci_io_read32(regspace->card->rawio, addr);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_PDAC:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			if (regspace->regsz > 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x609010, addr & 0xff);
			nva_wr32(regspace->cnum, 0x609014, addr >> 8);
			*val = 0;
			for (i = 0; i < regspace->regsz; i++)
				*val |= (uint64_t)(nva_rd32(regspace->cnum, 0x609018) & 0xff) << i * 8;
			return 0;
		case NVA_REGSPACE_EEPROM:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (addr >= 0x80)
				return NVA_ERR_RANGE;
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			nva_wr32(regspace->cnum, 0x60a400, 0x2000000 | addr << 8);
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			*val = nva_rd32(regspace->cnum, 0x60a400) & 0xff;
			return 0;
		case NVA_REGSPACE_VGA_CR:
			vgaio = 0x3d4;
			if (addr >= 0x100)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_SR:
			vgaio = 0x3c4;
			if (addr >= 8)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_GR:
			vgaio = 0x3ce;
			if (addr >= 0x10)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_AR:
			vgaio = 0x3c0;
			if (addr >= 0x20)
				return NVA_ERR_RANGE;
			goto vga;
		vga:
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (regspace->card->chipset.card_type == 0x01) {
				vgabase = 0x6d0000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			} else if (regspace->card->chipset.card_type < 0x50) {
				if (vgaio == 0x3c4 || vgaio == 0x3ce)
					vgabase = 0x0c0000;
				else
					vgabase = 0x601000;
				if (regspace->idx > 2)
					return NVA_ERR_NOSPC;
				if ((regspace->card->chipset.chipset < 0x17 || regspace->card->chipset.chipset == 0x1a || regspace->card->chipset.chipset == 0x20) && regspace->idx == 1)
					return NVA_ERR_NOSPC;
				vgabase += regspace->idx * 0x2000;
			} else {
				vgabase = 0x601000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			}
			if (vgaio == 0x3c0) {
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + 0x3c0);
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, addr);
				*val = nva_rd8(regspace->cnum, vgabase + 0x3c1);
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, idx);
			} else {
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + vgaio);
				nva_wr8(regspace->cnum, vgabase + vgaio, addr);
				*val = nva_rd8(regspace->cnum, vgabase + vgaio + 1);
				nva_wr8(regspace->cnum, vgabase + vgaio, idx);
			}
			return 0;
		case NVA_REGSPACE_VGA_ST:
			if (regspace->card->chipset.chipset < 0x41)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			uint32_t vstbase = 0x1380;
			if (regspace->card->chipset.card_type >= 0x50)
				vstbase = 0x619e40;
			uint32_t savepos = nva_rd32(regspace->cnum, vstbase+0xc);
			uint32_t savecfg = nva_rd32(regspace->cnum, vstbase+0x8);
			nva_wr32(regspace->cnum, vstbase+0xc, addr+1);
			nva_wr32(regspace->cnum, vstbase+0x8, 7);
			*val = nva_rd32(regspace->cnum, vstbase+0x0);
			nva_wr32(regspace->cnum, vstbase+0x8, savecfg);
			nva_wr32(regspace->cnum, vstbase+0xc, savepos);
			return 0;
		case NVA_REGSPACE_DPRAM:
			if (regspace->card->chipset.chipset == 0x34) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400bb0, addr);
				*val = nva_rd32(regspace->cnum, 0x400bb4);
				return 0;
			}
			if (regspace->card->chipset.card_type < 4 || regspace->card->chipset.card_type >= 0x20)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400828, addr);
			*val = nva_rd32(regspace->cnum, 0x40082c);
			return 0;
		case NVA_REGSPACE_PIPE:
			if (regspace->card->chipset.card_type < 0x10 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400f50, addr);
			*val = nva_rd32(regspace->cnum, 0x400f54);
			return 0;
		case NVA_REGSPACE_RDI:
			if (regspace->card->chipset.chipset == 0x17 || regspace->card->chipset.chipset == 0x18 || regspace->card->chipset.chipset == 0x1f) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400a08, addr);
				*val = nva_rd32(regspace->cnum, 0x400a0c);
				return 0;
			}
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400750, addr);
			*val = nva_rd32(regspace->cnum, 0x400754);
			return 0;
		case NVA_REGSPACE_RDIB:
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400750, addr);
			*val = nva_rd32(regspace->cnum, 0x400758);
			return 0;
		case NVA_REGSPACE_VCOMP_CODE:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17c8, addr);
			*val = nva_rd32(regspace->cnum, 0x1c17cc);
			return 0;
		case NVA_REGSPACE_VCOMP_REG:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17d0, addr/8);
			*val = nva_rd32(regspace->cnum, 0x1c17d4);
			*val |= (uint64_t)nva_rd32(regspace->cnum, 0x1c17d8) << 32;
			return 0;
		case NVA_REGSPACE_MACRO_CODE:
			if (regspace->card->chipset.chipset < 0xc0)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x40986c, 0x10);
			nva_wr32(regspace->cnum, 0x409ffc, 2);
			nva_wr32(regspace->cnum, 0x409928, 0xc);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40993c, 0xf);
			nva_wr32(regspace->cnum, 0x409928, 0xa);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40991c, 0x1);
			nva_wr32(regspace->cnum, 0x409928, 0x1);
			while (nva_rd32(regspace->cnum, 0x409928));
			for (i = 0; i < addr; i+=4) {
				nva_wr32(regspace->cnum, 0x409928, 0x6);
				while (nva_rd32(regspace->cnum, 0x409928));
			}
			nva_wr32(regspace->cnum, 0x409928, 0x6);
			while (nva_rd32(regspace->cnum, 0x409928));
			*val = nva_rd32(regspace->cnum, 0x409918);
			return 0;
		case NVA_REGSPACE_XT:
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1700, 0x30);
			nva_wr32(regspace->cnum, 0x700004, addr);
			nva_wr32(regspace->cnum, 0x70000, 1);
			while (nva_rd32(regspace->cnum, 0x70000));
			nva_wr32(regspace->cnum, 0x700000, 1);
			while (nva_rd32(regspace->cnum, 0x700000));
			*val = nva_rd32(regspace->cnum, 0x700004);
			return 0;
		default:
			return NVA_ERR_NOSPC;
	}
}